

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

Expression * __thiscall wasm::Builder::makeConstantExpression(Builder *this,Literal *value)

{
  Type type_00;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar1;
  bool bVar2;
  char cVar3;
  int32_t x;
  Const *pCVar4;
  Expression *pEVar5;
  HeapType heapType;
  RefFunc *pRVar6;
  long lVar7;
  I31New *pIVar8;
  StringConst *pSVar9;
  Literal *pLVar10;
  Literal *pLVar11;
  char *__assertion;
  size_t sVar12;
  Name func;
  IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
  IVar13;
  Literal local_c8;
  Literal local_b0;
  undefined1 local_98 [8];
  string string;
  value_type c;
  Type type;
  
  type_00.id = (value->type).id;
  if (type_00.id - 2 < 5) {
    wasm::Literal::Literal(&local_c8,value);
    pCVar4 = makeConst(this,&local_c8);
    pLVar11 = &local_c8;
  }
  else {
    bVar2 = Type::isNull(&value->type);
    if (bVar2) {
      pEVar5 = (Expression *)makeRefNull(this,type_00);
      return pEVar5;
    }
    cVar3 = wasm::Type::isFunction();
    if (cVar3 != '\0') {
      func = Literal::getFunc(value);
      heapType.id = wasm::Type::getHeapType();
      pRVar6 = makeRefFunc(this,func,heapType);
      return (Expression *)pRVar6;
    }
    cVar3 = wasm::Type::isRef();
    if ((cVar3 != '\0') && (lVar7 = wasm::Type::getHeapType(), lVar7 == 4)) {
      x = Literal::geti31(value,true);
      pCVar4 = makeConst<int>(this,x);
      pIVar8 = makeI31New(this,(Expression *)pCVar4);
      return (Expression *)pIVar8;
    }
    cVar3 = wasm::Type::isString();
    if (cVar3 != '\0') {
      local_98 = (undefined1  [8])&string._M_string_length;
      string._M_dataplus._M_p = (pointer)0x0;
      string._M_string_length._0_1_ = 0;
      wasm::Literal::getGCData();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&c);
      IVar13 = (IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                )SmallVector<wasm::Literal,_1UL>::end
                           ((SmallVector<wasm::Literal,_1UL> *)(string.field_2._8_8_ + 8));
      lVar7 = -0x18;
      pLVar11 = (Literal *)((long)&string.field_2 + 8);
      for (sVar12 = 0; IVar1.index = sVar12,
          IVar1.parent = (SmallVector<wasm::Literal,_1UL> *)(string.field_2._8_8_ + 8),
          IVar13 != IVar1; sVar12 = sVar12 + 1) {
        pLVar10 = (Literal *)(*(long *)(string.field_2._8_8_ + 0x28) + lVar7);
        if (sVar12 == 0) {
          pLVar10 = (Literal *)(string.field_2._8_8_ + 0x10);
        }
        wasm::Literal::Literal(pLVar11,pLVar10);
        wasm::Literal::getInteger();
        std::__cxx11::string::push_back((char)local_98);
        wasm::Literal::~Literal(pLVar11);
        lVar7 = lVar7 + 0x18;
      }
      IString::IString((IString *)&c.type,(string *)local_98);
      pSVar9 = makeStringConst(this,(Name)stack0xffffffffffffffa0);
      std::__cxx11::string::~string((string *)local_98);
      return (Expression *)pSVar9;
    }
    cVar3 = wasm::Type::isRef();
    if ((cVar3 == '\0') || (lVar7 = wasm::Type::getHeapType(), lVar7 != 0)) {
      cVar3 = wasm::Type::isTuple();
      if (cVar3 == '\0') {
        if (type_00.id < 7) {
          wasm::handle_unreachable
                    ("unsupported constant expression",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-builder.h"
                     ,0x4a7);
        }
        __assertion = "type.isBasic() && \"TODO: handle compound types\"";
      }
      else {
        __assertion = "!type.isTuple() && \"Unexpected tuple type\"";
      }
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-builder.h"
                    ,0x4a6,"Expression *wasm::Builder::makeConstantExpression(Literal)");
    }
    wasm::Literal::internalize();
    pEVar5 = makeConstantExpression(this,&local_b0);
    pCVar4 = (Const *)makeRefAs(this,ExternExternalize,pEVar5);
    pLVar11 = &local_b0;
  }
  wasm::Literal::~Literal(pLVar11);
  return (Expression *)pCVar4;
}

Assistant:

Expression* makeConstantExpression(Literal value) {
    auto type = value.type;
    if (type.isNumber()) {
      return makeConst(value);
    }
    if (value.isNull()) {
      return makeRefNull(type);
    }
    if (type.isFunction()) {
      return makeRefFunc(value.getFunc(), type.getHeapType());
    }
    if (type.isRef() && type.getHeapType() == HeapType::i31) {
      return makeI31New(makeConst(value.geti31()));
    }
    if (type.isString()) {
      // TODO: more than ascii support
      std::string string;
      for (auto c : value.getGCData()->values) {
        string.push_back(c.getInteger());
      }
      return makeStringConst(string);
    }
    if (type.isRef() && type.getHeapType() == HeapType::ext) {
      return makeRefAs(ExternExternalize,
                       makeConstantExpression(value.internalize()));
    }
    TODO_SINGLE_COMPOUND(type);
    WASM_UNREACHABLE("unsupported constant expression");
  }